

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O0

vector<std::pair<crnlib::vec<6U,_float>,_unsigned_int>_> * __thiscall
crnlib::vector<std::pair<crnlib::vec<6U,_float>,_unsigned_int>_>::operator=
          (vector<std::pair<crnlib::vec<6U,_float>,_unsigned_int>_> *this,
          vector<std::pair<crnlib::vec<6U,_float>,_unsigned_int>_> *other)

{
  uint local_34;
  pair<crnlib::vec<6U,_float>,_unsigned_int> *ppStack_30;
  uint i;
  pair<crnlib::vec<6U,_float>,_unsigned_int> *pSrc;
  pair<crnlib::vec<6U,_float>,_unsigned_int> *pDst;
  vector<std::pair<crnlib::vec<6U,_float>,_unsigned_int>_> *other_local;
  vector<std::pair<crnlib::vec<6U,_float>,_unsigned_int>_> *this_local;
  
  if (this != other) {
    if (this->m_capacity < other->m_size) {
      clear(this);
      increase_capacity(this,other->m_size,false,false);
    }
    else {
      resize(this,0,false);
    }
    ppStack_30 = other->m_p;
    pSrc = this->m_p;
    for (local_34 = other->m_size; local_34 != 0; local_34 = local_34 - 1) {
      helpers::
      construct<std::pair<crnlib::vec<6u,float>,unsigned_int>,std::pair<crnlib::vec<6u,float>,unsigned_int>>
                (pSrc,ppStack_30);
      ppStack_30 = ppStack_30 + 1;
      pSrc = pSrc + 1;
    }
    this->m_size = other->m_size;
  }
  return this;
}

Assistant:

inline vector& operator=(const vector& other)
        {
            if (this == &other)
            {
                return *this;
            }

            if (m_capacity >= other.m_size)
            {
                resize(0);
            }
            else
            {
                clear();
                increase_capacity(other.m_size, false);
            }

            if (CRNLIB_IS_BITWISE_COPYABLE(T))
            {
                memcpy(m_p, other.m_p, other.m_size * sizeof(T));
            }
            else
            {
                T* pDst = m_p;
                const T* pSrc = other.m_p;
                for (uint i = other.m_size; i > 0; i--)
                {
                    helpers::construct(pDst++, *pSrc++);
                }
            }

            m_size = other.m_size;

            return *this;
        }